

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O0

char * E_phrase(entity *etmp,char *verb)

{
  char *__src;
  char *local_28;
  char *verb_local;
  entity *etmp_local;
  
  if (etmp->emon == &youmonst) {
    local_28 = "You";
  }
  else {
    local_28 = Monnam(etmp->emon);
  }
  strcpy(E_phrase::wholebuf,local_28);
  if (*verb != '\0') {
    strcat(E_phrase::wholebuf," ");
    if (etmp->emon == &youmonst) {
      strcat(E_phrase::wholebuf,verb);
    }
    else {
      __src = vtense((char *)0x0,verb);
      strcat(E_phrase::wholebuf,__src);
    }
  }
  return E_phrase::wholebuf;
}

Assistant:

static const char *E_phrase(struct entity *etmp, const char *verb)
{
	static char wholebuf[80];

	strcpy(wholebuf, is_u(etmp) ? "You" : Monnam(etmp->emon));
	if (!*verb) return wholebuf;
	strcat(wholebuf, " ");
	if (is_u(etmp))
	    strcat(wholebuf, verb);
	else
	    strcat(wholebuf, vtense(NULL, verb));
	return wholebuf;
}